

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

bool __thiscall VmaDedicatedAllocationList::Validate(VmaDedicatedAllocationList *this)

{
  bool bVar1;
  size_t sVar2;
  ItemType *pIVar3;
  size_t sVar4;
  
  sVar2 = (this->m_AllocationList).m_Count;
  bVar1 = this->m_UseMutex;
  if (bVar1 == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_Mutex);
  }
  sVar4 = 0;
  for (pIVar3 = (this->m_AllocationList).m_Front; pIVar3 != (ItemType *)0x0;
      pIVar3 = (pIVar3->field_0).m_DedicatedAllocation.m_Next) {
    sVar4 = sVar4 + 1;
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->m_Mutex);
  }
  return sVar4 == sVar2;
}

Assistant:

bool VmaDedicatedAllocationList::Validate()
{
    const size_t declaredCount = m_AllocationList.GetCount();
    size_t actualCount = 0;
    VmaMutexLockRead lock(m_Mutex, m_UseMutex);
    for (VmaAllocation alloc = m_AllocationList.Front();
        alloc != VMA_NULL; alloc = m_AllocationList.GetNext(alloc))
    {
        ++actualCount;
    }
    VMA_VALIDATE(actualCount == declaredCount);

    return true;
}